

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

lua_Integer unpackint(lua_State *L,char *str,int islittle,int size,int issigned)

{
  char cVar1;
  ulong uVar2;
  int local_64;
  int local_54;
  int local_48;
  int mask_1;
  lua_Unsigned mask;
  int limit;
  int i;
  lua_Unsigned res;
  int issigned_local;
  int size_local;
  int islittle_local;
  char *str_local;
  lua_State *L_local;
  
  _limit = 0;
  mask._4_4_ = size;
  local_48 = size;
  if (8 < size) {
    local_48 = 8;
    mask._4_4_ = local_48;
  }
  while (mask._4_4_ = mask._4_4_ + -1, -1 < mask._4_4_) {
    if (islittle == 0) {
      local_54 = (size + -1) - mask._4_4_;
    }
    else {
      local_54 = mask._4_4_;
    }
    _limit = (ulong)(byte)str[local_54] | _limit << 8;
  }
  if (size < 8) {
    if (issigned != 0) {
      uVar2 = 1L << ((char)(size << 3) - 1U & 0x3f);
      _limit = (_limit ^ uVar2) - uVar2;
    }
  }
  else if (8 < size) {
    cVar1 = -1;
    if (issigned == 0 || -1 < (long)_limit) {
      cVar1 = '\0';
    }
    for (mask._4_4_ = local_48; mask._4_4_ < size; mask._4_4_ = mask._4_4_ + 1) {
      if (islittle == 0) {
        local_64 = (size + -1) - mask._4_4_;
      }
      else {
        local_64 = mask._4_4_;
      }
      if (str[local_64] != cVar1) {
        luaL_error(L,"%d-byte integer does not fit into Lua Integer",(ulong)(uint)size);
      }
    }
  }
  return _limit;
}

Assistant:

static lua_Integer unpackint (lua_State *L, const char *str,
                              int islittle, int size, int issigned) {
  lua_Unsigned res = 0;
  int i;
  int limit = (size  <= SZINT) ? size : SZINT;
  for (i = limit - 1; i >= 0; i--) {
    res <<= NB;
    res |= (lua_Unsigned)(unsigned char)str[islittle ? i : size - 1 - i];
  }
  if (size < SZINT) {  /* real size smaller than lua_Integer? */
    if (issigned) {  /* needs sign extension? */
      lua_Unsigned mask = (lua_Unsigned)1 << (size*NB - 1);
      res = ((res ^ mask) - mask);  /* do sign extension */
    }
  }
  else if (size > SZINT) {  /* must check unread bytes */
    int mask = (!issigned || (lua_Integer)res >= 0) ? 0 : MC;
    for (i = limit; i < size; i++) {
      if (l_unlikely((unsigned char)str[islittle ? i : size - 1 - i] != mask))
        luaL_error(L, "%d-byte integer does not fit into Lua Integer", size);
    }
  }
  return (lua_Integer)res;
}